

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.cc
# Opt level: O2

shared_ptr<event> event::parse(char *buf,size_t buf_len,bool require_exact_size)

{
  element_type *peVar1;
  bool bVar2;
  int iVar3;
  uint32_t uVar4;
  undefined4 extraout_var;
  undefined7 in_register_00000011;
  size_t len_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  shared_ptr<event> sVar6;
  uint8_t event_type;
  shared_ptr<event> event;
  uint8_t *pointer;
  element_type *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_38;
  uint32_t event_no;
  uint32_t len;
  
  len_00 = CONCAT71(in_register_00000011,require_exact_size);
  pointer = (uint8_t *)buf_len;
  bVar2 = anon_unknown.dwarf_3235c::consume_bytes<unsigned_int>
                    ((uint8_t *)buf_len,len_00,&pointer,&len);
  _Var5._M_pi = extraout_RDX;
  if (((!bVar2) ||
      (bVar2 = anon_unknown.dwarf_3235c::consume_bytes<unsigned_char>
                         ((uint8_t *)buf_len,len_00,&pointer,&event_type),
      _Var5._M_pi = extraout_RDX_00, !bVar2)) ||
     (bVar2 = anon_unknown.dwarf_3235c::consume_bytes<unsigned_int>
                        ((uint8_t *)buf_len,len_00,&pointer,&event_no),
     _Var5._M_pi = extraout_RDX_01, !bVar2)) {
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
    goto LAB_00107770;
  }
  switch(event_type) {
  case '\0':
    std::make_shared<new_game>();
    break;
  case '\x01':
    std::make_shared<pixel>();
    break;
  case '\x02':
    std::make_shared<player_eliminated>();
    break;
  case '\x03':
    std::make_shared<game_over>();
    break;
  default:
    event.super___shared_ptr<event,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    event.super___shared_ptr<event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    goto LAB_00107864;
  }
  peVar1 = local_40;
  event.super___shared_ptr<event,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_40;
  event.super___shared_ptr<event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Stack_38._M_pi;
  local_40 = (element_type *)0x0;
  _Stack_38._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38);
  if (peVar1 == (element_type *)0x0) {
LAB_00107864:
    buf[0] = '\0';
    buf[1] = '\0';
    buf[2] = '\0';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
    buf[6] = '\0';
    buf[7] = '\0';
    buf[8] = '\0';
    buf[9] = '\0';
    buf[10] = '\0';
    buf[0xb] = '\0';
    buf[0xc] = '\0';
    buf[0xd] = '\0';
    buf[0xe] = '\0';
    buf[0xf] = '\0';
  }
  else {
    peVar1->len = len;
    peVar1->event_no = event_no;
    iVar3 = (*peVar1->_vptr_event[5])(peVar1,pointer,(ulong)len - 5);
    pointer = (uint8_t *)CONCAT44(extraout_var,iVar3);
    if ((pointer == (uint8_t *)0x0) ||
       (bVar2 = anon_unknown.dwarf_3235c::consume_bytes<unsigned_int>
                          ((uint8_t *)buf_len,len_00,&pointer,
                           &(event.super___shared_ptr<event,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                            crc32), !bVar2)) goto LAB_00107864;
    uVar4 = xcrc32((uchar *)buf_len,((int)pointer - (int)buf_len) + -4,0);
    _Var5 = event.super___shared_ptr<event,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    if (uVar4 != (event.super___shared_ptr<event,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->crc32) {
      fwrite("CRC checksum mismatch\n",0x16,1,_stderr);
      goto LAB_00107864;
    }
    *(element_type **)buf = event.super___shared_ptr<event,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    event.super___shared_ptr<event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(buf + 8) = _Var5._M_pi;
    event.super___shared_ptr<event,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&event.super___shared_ptr<event,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  _Var5._M_pi = extraout_RDX_02;
LAB_00107770:
  sVar6.super___shared_ptr<event,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var5._M_pi;
  sVar6.super___shared_ptr<event,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)buf;
  return (shared_ptr<event>)sVar6.super___shared_ptr<event,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<event> event::parse(const char* buf, size_t buf_len, bool require_exact_size/* = false*/)
{
	const std::uint8_t* stream = reinterpret_cast<const std::uint8_t*>(buf);
	const std::uint8_t* pointer = stream;

	std::uint32_t len;
	if (!consume_bytes(stream, buf_len, pointer, len))
		return nullptr;

	std::uint8_t event_type;
	if (!consume_bytes(stream, buf_len, pointer, event_type))
		return nullptr;

	std::uint32_t event_no;
	if (!consume_bytes(stream, buf_len, pointer, event_no))
		return nullptr;

	auto event = create_event(static_cast<event_type_t>(event_type));
	// Parsed event type is invalid or couldn't create event
	if (event == nullptr)
		return nullptr;
	
	event->len = len;
	event->event_no = event_no;

	pointer = event->parse_event_data(pointer, len - sizeof(event::event_no) - sizeof(event::event_type));
	// Could not succesfully parse event_data depending on event type
	if (pointer == nullptr)
		return nullptr;

	if (!consume_bytes(stream, buf_len, pointer, event->crc32))
		return nullptr;

	// Reported message length and parsed len do not match
	//if (require_exact_size && len != (pointer - stream) - sizeof(event::crc32) - sizeof(event::len))
	//	return nullptr;

	// CRC checksum mismatch
	auto crc = xcrc32(stream, (pointer - sizeof(event::crc32)) - stream, 0);
	if (crc != event->crc32) {
		fprintf(stderr, "CRC checksum mismatch\n");
		return nullptr;
	}

	// Data was exact, event could be created and crc matches - we're good to go
	return event;
}